

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::ShiftRightU_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  uint64 uVar6;
  uint64 uVar7;
  Var pvVar8;
  uint uVar9;
  double value;
  
  if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9b9f5;
    uVar4 = JavascriptConversion::ToUInt32_Full(aLeft,scriptContext);
    aLeft = (Var)(ulong)uVar4;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a9bc28;
    *puVar5 = 0;
LAB_00a9b9f5:
    if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00a9bc28;
      *puVar5 = 0;
    }
  }
  if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9badd;
    uVar4 = JavascriptConversion::ToUInt32_Full(aRight,scriptContext);
    aRight = (Var)(ulong)uVar4;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a9bc28;
    *puVar5 = 0;
LAB_00a9badd:
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00a9bc28;
      *puVar5 = 0;
    }
  }
  bVar1 = (byte)aRight & 0x1f;
  uVar9 = (uint)aLeft >> bVar1;
  if ((int)((uint)aLeft >> bVar1) < 0) {
    value = (double)uVar9;
    uVar6 = NumberUtilities::ToSpecial(value);
    bVar3 = NumberUtilities::IsNan(value);
    if (bVar3) {
      uVar7 = NumberUtilities::ToSpecial(value);
      if (uVar7 != 0xfff8000000000000) {
        uVar7 = NumberUtilities::ToSpecial(value);
        if (uVar7 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar3) {
LAB_00a9bc28:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
      }
    }
    pvVar8 = (Var)(uVar6 ^ 0xfffc000000000000);
  }
  else {
    pvVar8 = (Var)((ulong)uVar9 | 0x1000000000000);
  }
  return pvVar8;
}

Assistant:

Var JavascriptMath::ShiftRightU_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_ShiftRightU_Full);
            uint32 nValue   = JavascriptConversion::ToUInt32(aLeft, scriptContext);
            uint32 nShift   = JavascriptConversion::ToUInt32(aRight, scriptContext);

            uint32 nResult  = nValue >> (nShift & 0x1F);

            return JavascriptNumber::ToVar(nResult,scriptContext);
            JIT_HELPER_END(Op_ShiftRightU_Full);
        }